

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

unsigned_long __thiscall v128::To<unsigned_long>(v128 *this,int lane)

{
  if ((long)lane * 8 + 8U < 0x11) {
    return *(unsigned_long *)(this->v + (long)lane * 8);
  }
  __assert_fail("(lane + 1) * sizeof(T) <= sizeof(v)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/common.h"
                ,0x8b,"T v128::To(int) const [T = unsigned long]");
}

Assistant:

T To(int lane) const {
    static_assert(sizeof(T) <= sizeof(v), "Invalid cast!");
    assert((lane + 1) * sizeof(T) <= sizeof(v));
    T result;
    wabt::MemcpyEndianAware(&result, v, sizeof(result), sizeof(v), 0,
                            lane * sizeof(T), sizeof(result));
    return result;
  }